

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

void __thiscall TRM::Vertex::insert_below(Vertex *this,Edge *e)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Edge *pEVar5;
  Vertex *pVVar6;
  Edge *pEVar7;
  bool bVar8;
  
  fVar1 = *(float *)(e->top + 0x48);
  fVar2 = *(float *)(e->top + 0x4c);
  fVar3 = *(float *)(e->bottom + 0x48);
  fVar4 = *(float *)(e->bottom + 0x4c);
  if ((fVar1 == fVar3) && (!NAN(fVar1) && !NAN(fVar3))) {
    if ((fVar2 == fVar4) && (!NAN(fVar2) && !NAN(fVar4))) {
      return;
    }
  }
  if ((fVar4 < fVar2) || (fVar3 < fVar1 && fVar2 == fVar4)) {
    return;
  }
  pEVar5 = *(Edge **)(this + 0x28);
  bVar8 = pEVar5 == (Edge *)0x0;
  if (!bVar8) {
    if (0.0 <= pEVar5->le_a * (double)fVar3 + pEVar5->le_b * (double)fVar4 + pEVar5->le_c) {
      do {
        pEVar7 = pEVar5;
        pEVar5 = pEVar7->below_next;
        bVar8 = pEVar5 == (Edge *)0x0;
        if (bVar8) break;
      } while (0.0 <= pEVar5->le_a * (double)fVar3 + pEVar5->le_b * (double)fVar4 + pEVar5->le_c);
      goto LAB_001079e7;
    }
  }
  pEVar7 = (Edge *)0x0;
LAB_001079e7:
  e->below_prev = pEVar7;
  e->below_next = pEVar5;
  pVVar6 = (Vertex *)&pEVar7->below_next;
  if (pEVar7 == (Edge *)0x0) {
    pVVar6 = this + 0x28;
  }
  *(Edge **)pVVar6 = e;
  pVVar6 = (Vertex *)&pEVar5->below_prev;
  if (bVar8) {
    pVVar6 = this + 0x30;
  }
  *(Edge **)pVVar6 = e;
  return;
}

Assistant:

void Vertex::insert_below(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not below
  ) {
    return;
  }

  Edge* below_prev = nullptr;
  Edge* below_next = nullptr;

  for (below_next = edge_below.head; below_next != nullptr;
       below_next = below_next->below_next) {
    if (below_next->is_right_of(e->bottom->point)) {
      break;
    }

    below_prev = below_next;
  }

  LinkedList<Edge>::Insert<&Edge::below_prev, &Edge::below_next>(
      e, below_prev, below_next, &edge_below.head, &edge_below.tail);
}